

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

Texture * rw::xbox::readNativeTexture(Stream *stream)

{
  int iVar1;
  FILE *pFVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int16 iVar7;
  uint16 uVar8;
  uint16 uVar9;
  uint32 uVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  undefined8 *puVar14;
  void *pvVar15;
  uint8 *puVar16;
  uint local_ac;
  uint8 *data;
  XboxRaster *ras;
  XboxRaster *ras_1;
  Raster *raster;
  int32 totalSize;
  int32 compression;
  int32 type;
  int32 numLevels;
  int32 depth;
  int32 height;
  int32 width;
  bool32 unknownFlag;
  bool32 hasAlpha;
  int32 format;
  Texture *tex;
  Error _e_2;
  Error _e_1;
  Error _e;
  uint32 platform;
  uint32 vers;
  Stream *stream_local;
  
  bVar3 = findChunk(stream,1,(uint32 *)0x0,&_e.code);
  if (bVar3) {
    _e.plugin = Stream::readU32(stream);
    if (_e.plugin == 5) {
      if (_e.code < 0x34001) {
        tex._0_4_ = 2;
        tex._4_4_ = 0x80000005;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xbox.cpp",
                0x377);
        pFVar2 = _stderr;
        pcVar13 = dbgsprint(0x80000005,(ulong)_e.code);
        fprintf(pFVar2,"%s\n",pcVar13);
        setError((Error *)&tex);
        stream_local = (Stream *)0x0;
      }
      else {
        stream_local = (Stream *)Texture::create((Raster *)0x0);
        if ((Texture *)stream_local == (Texture *)0x0) {
          stream_local = (Stream *)0x0;
        }
        else {
          uVar10 = Stream::readU32(stream);
          ((Texture *)stream_local)->filterAddressing = uVar10;
          (*stream->_vptr_Stream[4])(stream,((Texture *)stream_local)->name,0x20);
          (*stream->_vptr_Stream[4])(stream,((Texture *)stream_local)->mask,0x20);
          uVar11 = Stream::readI32(stream);
          iVar7 = Stream::readI16(stream);
          Stream::readI16(stream);
          uVar8 = Stream::readU16(stream);
          uVar9 = Stream::readU16(stream);
          bVar4 = Stream::readU8(stream);
          bVar5 = Stream::readU8(stream);
          local_ac = (uint)bVar5;
          bVar5 = Stream::readU8(stream);
          bVar6 = Stream::readU8(stream);
          uVar12 = Stream::readI32(stream);
          if (bVar6 == 0) {
            ras_1 = (XboxRaster *)
                    Raster::create((uint)uVar8,(uint)uVar9,(uint)bVar4,uVar11 | bVar5,5);
          }
          else {
            ras_1 = (XboxRaster *)
                    Raster::create((uint)uVar8,(uint)uVar9,(uint)bVar4,uVar11 | bVar5 | 0x80,5);
            puVar14 = (undefined8 *)((long)&((Raster *)ras_1)->platform + (long)nativeRasterOffset);
            *(uint *)(puVar14 + 2) = (uint)bVar6;
            *(bool *)(puVar14 + 3) = iVar7 != 0;
            if ((((Raster *)ras_1)->format & 0x8000U) == 0) {
              local_ac = 1;
            }
            pvVar15 = createTexture(((Raster *)ras_1)->width,((Raster *)ras_1)->height,local_ac,
                                    *(uint32 *)(puVar14 + 2));
            *puVar14 = pvVar15;
            *(undefined1 *)((long)puVar14 + 0x19) = 1;
            ((Raster *)ras_1)->flags = ((Raster *)ras_1)->flags & 0xffffff7f;
          }
          iVar1 = nativeRasterOffset;
          ((Texture *)stream_local)->raster = (Raster *)ras_1;
          if ((ras_1->format & 0x4000) == 0) {
            if ((ras_1->format & 0x2000) != 0) {
              (*stream->_vptr_Stream[4])
                        (stream,*(undefined8 *)((long)&ras_1->palette + (long)iVar1),0x400);
            }
          }
          else {
            (*stream->_vptr_Stream[4])
                      (stream,*(undefined8 *)((long)&ras_1->palette + (long)iVar1),0x80);
          }
          puVar16 = Raster::lock((Raster *)ras_1,0,5);
          (*stream->_vptr_Stream[4])(stream,puVar16,(ulong)uVar12);
          Raster::unlock((Raster *)ras_1,0);
        }
      }
    }
    else {
      _e_2.plugin = 2;
      _e_2.code = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xbox.cpp",0x373
             );
      pFVar2 = _stderr;
      pcVar13 = dbgsprint(0x80000006,(ulong)_e.plugin);
      fprintf(pFVar2,"%s\n",pcVar13);
      setError(&_e_2);
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.plugin = 2;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/xbox.cpp",0x36e);
    pFVar2 = _stderr;
    pcVar13 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar2,"%s\n",pcVar13);
    setError(&_e_1);
    stream_local = (Stream *)0x0;
  }
  return (Texture *)stream_local;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 vers, platform;
	if(!findChunk(stream, ID_STRUCT, nil, &vers)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_XBOX){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	if(vers < 0x34001){
		RWERROR((ERR_VERSION, vers));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;


	// Texture
	tex->filterAddressing = stream->readU32();
	stream->read8(tex->name, 32);
	stream->read8(tex->mask, 32);

//if(strcmp(tex->name, "bluallu") == 0)
//__debugbreak();

	// Raster
	int32 format = stream->readI32();
	bool32 hasAlpha = stream->readI16();
	bool32 unknownFlag = stream->readI16();
	int32 width = stream->readU16();
	int32 height = stream->readU16();
	int32 depth = stream->readU8();
	int32 numLevels = stream->readU8();
	int32 type = stream->readU8();
	int32 compression = stream->readU8();
	int32 totalSize = stream->readI32();

	// isn't this the cube map flag?
	assert(unknownFlag == 0);
	Raster *raster;
	if(compression){
		raster = Raster::create(width, height, depth, format | type | Raster::DONTALLOCATE, PLATFORM_XBOX);
		XboxRaster *ras = GETXBOXRASTEREXT(raster);
		ras->format = compression;
		ras->hasAlpha = hasAlpha;
		ras->texture = createTexture(raster->width, raster->height,
	                                     raster->format & Raster::MIPMAP ? numLevels : 1,
	                                     ras->format);
		ras->customFormat = 1;
		raster->flags &= ~Raster::DONTALLOCATE;
	}else
		raster = Raster::create(width, height, depth, format | type, PLATFORM_XBOX);
	XboxRaster *ras = GETXBOXRASTEREXT(raster);
	tex->raster = raster;

	if(raster->format & Raster::PAL4)
		stream->read8(ras->palette, 4*32);
	else if(raster->format & Raster::PAL8)
		stream->read8(ras->palette, 4*256);

	// exploit the fact that mipmaps are allocated consecutively
	uint8 *data = raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
	stream->read8(data, totalSize);
	raster->unlock(0);

	return tex;
}